

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece_model.pb.cc
# Opt level: O0

void __thiscall sentencepiece::TrainerSpec::MergeFrom(TrainerSpec *this,TrainerSpec *from)

{
  uint uVar1;
  TrainerSpec *this_00;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_01;
  long in_RSI;
  long in_RDI;
  uint32 cached_has_bits;
  TrainerSpec *in_stack_fffffffffffffeb8;
  string *in_stack_fffffffffffffec8;
  TrainerSpec *in_stack_fffffffffffffed0;
  ExtensionSet *in_stack_ffffffffffffff08;
  ExtensionSet *in_stack_ffffffffffffff10;
  
  google::protobuf::internal::ExtensionSet::MergeFrom
            (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  this_01 = (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)(in_RDI + 8);
  this_00 = (TrainerSpec *)(in_RSI + 8);
  if (((uint)(this_00->super_MessageLite)._vptr_MessageLite & 1) == 1) {
    if (((uint)(this_00->super_MessageLite)._vptr_MessageLite & 1) == 1) {
      google::protobuf::internal::InternalMetadata::
      PtrValue<google::protobuf::internal::InternalMetadata::Container<std::__cxx11::string>>
                ((InternalMetadata *)this_00);
      in_stack_fffffffffffffeb8 = this_00;
    }
    else {
      (*(code *)0x0)();
      in_stack_fffffffffffffeb8 = this_00;
    }
    google::protobuf::internal::InternalMetadata::DoMergeFrom<std::__cxx11::string>
              ((InternalMetadata *)this_01,(string *)in_stack_fffffffffffffeb8);
  }
  google::protobuf::
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::MergeFrom(this_01,(RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)in_stack_fffffffffffffeb8);
  google::protobuf::
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::MergeFrom(this_01,(RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)in_stack_fffffffffffffeb8);
  google::protobuf::
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::MergeFrom(this_01,(RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)in_stack_fffffffffffffeb8);
  google::protobuf::
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::MergeFrom(this_01,(RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)in_stack_fffffffffffffeb8);
  uVar1 = *(uint *)(in_RSI + 0x28);
  if ((uVar1 & 0xff) != 0) {
    if ((uVar1 & 1) != 0) {
      _internal_model_prefix_abi_cxx11_(in_stack_fffffffffffffeb8);
      _internal_set_model_prefix(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
    }
    if ((uVar1 & 2) != 0) {
      _internal_input_format_abi_cxx11_(in_stack_fffffffffffffeb8);
      _internal_set_input_format(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
    }
    if ((uVar1 & 4) != 0) {
      _internal_required_chars_abi_cxx11_(in_stack_fffffffffffffeb8);
      _internal_set_required_chars(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
    }
    if ((uVar1 & 8) != 0) {
      _internal_unk_surface_abi_cxx11_(in_stack_fffffffffffffeb8);
      _internal_set_unk_surface(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
    }
    if ((uVar1 & 0x10) != 0) {
      _internal_unk_piece_abi_cxx11_(in_stack_fffffffffffffeb8);
      _internal_set_unk_piece(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
    }
    if ((uVar1 & 0x20) != 0) {
      _internal_bos_piece_abi_cxx11_(in_stack_fffffffffffffeb8);
      _internal_set_bos_piece(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
    }
    if ((uVar1 & 0x40) != 0) {
      _internal_eos_piece_abi_cxx11_(in_stack_fffffffffffffeb8);
      _internal_set_eos_piece(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
    }
    if ((uVar1 & 0x80) != 0) {
      _internal_pad_piece_abi_cxx11_(in_stack_fffffffffffffeb8);
      _internal_set_pad_piece(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
    }
  }
  if ((uVar1 & 0xff00) != 0) {
    if ((uVar1 & 0x100) != 0) {
      _internal_pretokenization_delimiter_abi_cxx11_(in_stack_fffffffffffffeb8);
      _internal_set_pretokenization_delimiter(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
    }
    if ((uVar1 & 0x200) != 0) {
      _internal_seed_sentencepieces_file_abi_cxx11_(in_stack_fffffffffffffeb8);
      _internal_set_seed_sentencepieces_file(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
    }
    if ((uVar1 & 0x400) != 0) {
      *(undefined4 *)(in_RDI + 0xe8) = *(undefined4 *)(in_RSI + 0xe8);
    }
    if ((uVar1 & 0x800) != 0) {
      *(undefined4 *)(in_RDI + 0xec) = *(undefined4 *)(in_RSI + 0xec);
    }
    if ((uVar1 & 0x1000) != 0) {
      *(undefined8 *)(in_RDI + 0xf0) = *(undefined8 *)(in_RSI + 0xf0);
    }
    if ((uVar1 & 0x2000) != 0) {
      *(undefined4 *)(in_RDI + 0xf8) = *(undefined4 *)(in_RSI + 0xf8);
    }
    if ((uVar1 & 0x4000) != 0) {
      *(byte *)(in_RDI + 0xfc) = *(byte *)(in_RSI + 0xfc) & 1;
    }
    if ((uVar1 & 0x8000) != 0) {
      *(byte *)(in_RDI + 0xfd) = *(byte *)(in_RSI + 0xfd) & 1;
    }
    *(uint *)(in_RDI + 0x28) = uVar1 | *(uint *)(in_RDI + 0x28);
  }
  if ((uVar1 & 0xff0000) != 0) {
    if ((uVar1 & 0x10000) != 0) {
      *(byte *)(in_RDI + 0xfe) = *(byte *)(in_RSI + 0xfe) & 1;
    }
    if ((uVar1 & 0x20000) != 0) {
      *(byte *)(in_RDI + 0xff) = *(byte *)(in_RSI + 0xff) & 1;
    }
    if ((uVar1 & 0x40000) != 0) {
      *(byte *)(in_RDI + 0x100) = *(byte *)(in_RSI + 0x100) & 1;
    }
    if ((uVar1 & 0x80000) != 0) {
      *(byte *)(in_RDI + 0x101) = *(byte *)(in_RSI + 0x101) & 1;
    }
    if ((uVar1 & 0x100000) != 0) {
      *(byte *)(in_RDI + 0x102) = *(byte *)(in_RSI + 0x102) & 1;
    }
    if ((uVar1 & 0x200000) != 0) {
      *(undefined4 *)(in_RDI + 0x104) = *(undefined4 *)(in_RSI + 0x104);
    }
    if ((uVar1 & 0x400000) != 0) {
      *(undefined4 *)(in_RDI + 0x108) = *(undefined4 *)(in_RSI + 0x108);
    }
    if ((uVar1 & 0x800000) != 0) {
      *(undefined8 *)(in_RDI + 0x110) = *(undefined8 *)(in_RSI + 0x110);
    }
    *(uint *)(in_RDI + 0x28) = uVar1 | *(uint *)(in_RDI + 0x28);
  }
  if ((uVar1 & 0xff000000) != 0) {
    if ((uVar1 & 0x1000000) != 0) {
      *(undefined4 *)(in_RDI + 0x118) = *(undefined4 *)(in_RSI + 0x118);
    }
    if ((uVar1 & 0x2000000) != 0) {
      *(undefined4 *)(in_RDI + 0x11c) = *(undefined4 *)(in_RSI + 0x11c);
    }
    if ((uVar1 & 0x4000000) != 0) {
      *(undefined4 *)(in_RDI + 0x120) = *(undefined4 *)(in_RSI + 0x120);
    }
    if ((uVar1 & 0x8000000) != 0) {
      *(undefined4 *)(in_RDI + 0x124) = *(undefined4 *)(in_RSI + 0x124);
    }
    if ((uVar1 & 0x10000000) != 0) {
      *(undefined4 *)(in_RDI + 0x128) = *(undefined4 *)(in_RSI + 0x128);
    }
    if ((uVar1 & 0x20000000) != 0) {
      *(undefined4 *)(in_RDI + 300) = *(undefined4 *)(in_RSI + 300);
    }
    if ((uVar1 & 0x40000000) != 0) {
      *(undefined4 *)(in_RDI + 0x130) = *(undefined4 *)(in_RSI + 0x130);
    }
    if ((uVar1 & 0x80000000) != 0) {
      *(undefined4 *)(in_RDI + 0x134) = *(undefined4 *)(in_RSI + 0x134);
    }
    *(uint *)(in_RDI + 0x28) = uVar1 | *(uint *)(in_RDI + 0x28);
  }
  uVar1 = *(uint *)(in_RSI + 0x2c);
  if ((uVar1 & 0xff) != 0) {
    if ((uVar1 & 1) != 0) {
      *(undefined4 *)(in_RDI + 0x138) = *(undefined4 *)(in_RSI + 0x138);
    }
    if ((uVar1 & 2) != 0) {
      *(byte *)(in_RDI + 0x13c) = *(byte *)(in_RSI + 0x13c) & 1;
    }
    if ((uVar1 & 4) != 0) {
      *(byte *)(in_RDI + 0x13d) = *(byte *)(in_RSI + 0x13d) & 1;
    }
    if ((uVar1 & 8) != 0) {
      *(byte *)(in_RDI + 0x13e) = *(byte *)(in_RSI + 0x13e) & 1;
    }
    if ((uVar1 & 0x10) != 0) {
      *(byte *)(in_RDI + 0x13f) = *(byte *)(in_RSI + 0x13f) & 1;
    }
    if ((uVar1 & 0x20) != 0) {
      *(byte *)(in_RDI + 0x140) = *(byte *)(in_RSI + 0x140) & 1;
    }
    if ((uVar1 & 0x40) != 0) {
      *(byte *)(in_RDI + 0x141) = *(byte *)(in_RSI + 0x141) & 1;
    }
    if ((uVar1 & 0x80) != 0) {
      *(undefined4 *)(in_RDI + 0x144) = *(undefined4 *)(in_RSI + 0x144);
    }
    *(uint *)(in_RDI + 0x2c) = uVar1 | *(uint *)(in_RDI + 0x2c);
  }
  if ((uVar1 & 0x300) != 0) {
    if ((uVar1 & 0x100) != 0) {
      *(undefined4 *)(in_RDI + 0x148) = *(undefined4 *)(in_RSI + 0x148);
    }
    if ((uVar1 & 0x200) != 0) {
      *(undefined4 *)(in_RDI + 0x14c) = *(undefined4 *)(in_RSI + 0x14c);
    }
    *(uint *)(in_RDI + 0x2c) = uVar1 | *(uint *)(in_RDI + 0x2c);
  }
  return;
}

Assistant:

void TrainerSpec::MergeFrom(const TrainerSpec& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:sentencepiece.TrainerSpec)
  GOOGLE_DCHECK_NE(&from, this);
  _extensions_.MergeFrom(from._extensions_);
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  input_.MergeFrom(from.input_);
  accept_language_.MergeFrom(from.accept_language_);
  control_symbols_.MergeFrom(from.control_symbols_);
  user_defined_symbols_.MergeFrom(from.user_defined_symbols_);
  cached_has_bits = from._has_bits_[0];
  if (cached_has_bits & 0x000000ffu) {
    if (cached_has_bits & 0x00000001u) {
      _internal_set_model_prefix(from._internal_model_prefix());
    }
    if (cached_has_bits & 0x00000002u) {
      _internal_set_input_format(from._internal_input_format());
    }
    if (cached_has_bits & 0x00000004u) {
      _internal_set_required_chars(from._internal_required_chars());
    }
    if (cached_has_bits & 0x00000008u) {
      _internal_set_unk_surface(from._internal_unk_surface());
    }
    if (cached_has_bits & 0x00000010u) {
      _internal_set_unk_piece(from._internal_unk_piece());
    }
    if (cached_has_bits & 0x00000020u) {
      _internal_set_bos_piece(from._internal_bos_piece());
    }
    if (cached_has_bits & 0x00000040u) {
      _internal_set_eos_piece(from._internal_eos_piece());
    }
    if (cached_has_bits & 0x00000080u) {
      _internal_set_pad_piece(from._internal_pad_piece());
    }
  }
  if (cached_has_bits & 0x0000ff00u) {
    if (cached_has_bits & 0x00000100u) {
      _internal_set_pretokenization_delimiter(from._internal_pretokenization_delimiter());
    }
    if (cached_has_bits & 0x00000200u) {
      _internal_set_seed_sentencepieces_file(from._internal_seed_sentencepieces_file());
    }
    if (cached_has_bits & 0x00000400u) {
      self_test_sample_size_ = from.self_test_sample_size_;
    }
    if (cached_has_bits & 0x00000800u) {
      mining_sentence_size_ = from.mining_sentence_size_;
    }
    if (cached_has_bits & 0x00001000u) {
      input_sentence_size_ = from.input_sentence_size_;
    }
    if (cached_has_bits & 0x00002000u) {
      training_sentence_size_ = from.training_sentence_size_;
    }
    if (cached_has_bits & 0x00004000u) {
      enable_differential_privacy_ = from.enable_differential_privacy_;
    }
    if (cached_has_bits & 0x00008000u) {
      treat_whitespace_as_suffix_ = from.treat_whitespace_as_suffix_;
    }
    _has_bits_[0] |= cached_has_bits;
  }
  if (cached_has_bits & 0x00ff0000u) {
    if (cached_has_bits & 0x00010000u) {
      allow_whitespace_only_pieces_ = from.allow_whitespace_only_pieces_;
    }
    if (cached_has_bits & 0x00020000u) {
      split_digits_ = from.split_digits_;
    }
    if (cached_has_bits & 0x00040000u) {
      byte_fallback_ = from.byte_fallback_;
    }
    if (cached_has_bits & 0x00080000u) {
      use_all_vocab_ = from.use_all_vocab_;
    }
    if (cached_has_bits & 0x00100000u) {
      train_extremely_large_corpus_ = from.train_extremely_large_corpus_;
    }
    if (cached_has_bits & 0x00200000u) {
      unk_id_ = from.unk_id_;
    }
    if (cached_has_bits & 0x00400000u) {
      differential_privacy_noise_level_ = from.differential_privacy_noise_level_;
    }
    if (cached_has_bits & 0x00800000u) {
      differential_privacy_clipping_threshold_ = from.differential_privacy_clipping_threshold_;
    }
    _has_bits_[0] |= cached_has_bits;
  }
  if (cached_has_bits & 0xff000000u) {
    if (cached_has_bits & 0x01000000u) {
      model_type_ = from.model_type_;
    }
    if (cached_has_bits & 0x02000000u) {
      vocab_size_ = from.vocab_size_;
    }
    if (cached_has_bits & 0x04000000u) {
      character_coverage_ = from.character_coverage_;
    }
    if (cached_has_bits & 0x08000000u) {
      seed_sentencepiece_size_ = from.seed_sentencepiece_size_;
    }
    if (cached_has_bits & 0x10000000u) {
      shrinking_factor_ = from.shrinking_factor_;
    }
    if (cached_has_bits & 0x20000000u) {
      num_threads_ = from.num_threads_;
    }
    if (cached_has_bits & 0x40000000u) {
      num_sub_iterations_ = from.num_sub_iterations_;
    }
    if (cached_has_bits & 0x80000000u) {
      max_sentence_length_ = from.max_sentence_length_;
    }
    _has_bits_[0] |= cached_has_bits;
  }
  cached_has_bits = from._has_bits_[1];
  if (cached_has_bits & 0x000000ffu) {
    if (cached_has_bits & 0x00000001u) {
      max_sentencepiece_length_ = from.max_sentencepiece_length_;
    }
    if (cached_has_bits & 0x00000002u) {
      shuffle_input_sentence_ = from.shuffle_input_sentence_;
    }
    if (cached_has_bits & 0x00000004u) {
      split_by_unicode_script_ = from.split_by_unicode_script_;
    }
    if (cached_has_bits & 0x00000008u) {
      split_by_number_ = from.split_by_number_;
    }
    if (cached_has_bits & 0x00000010u) {
      split_by_whitespace_ = from.split_by_whitespace_;
    }
    if (cached_has_bits & 0x00000020u) {
      vocabulary_output_piece_score_ = from.vocabulary_output_piece_score_;
    }
    if (cached_has_bits & 0x00000040u) {
      hard_vocab_limit_ = from.hard_vocab_limit_;
    }
    if (cached_has_bits & 0x00000080u) {
      bos_id_ = from.bos_id_;
    }
    _has_bits_[1] |= cached_has_bits;
  }
  if (cached_has_bits & 0x00000300u) {
    if (cached_has_bits & 0x00000100u) {
      eos_id_ = from.eos_id_;
    }
    if (cached_has_bits & 0x00000200u) {
      pad_id_ = from.pad_id_;
    }
    _has_bits_[1] |= cached_has_bits;
  }
}